

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Interaction * __thiscall
pbrt::Transform::ApplyInverse(Interaction *__return_storage_ptr__,Transform *this,Interaction *in)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Transform t;
  Transform local_98;
  
  __return_storage_ptr__->mediumInterface = (MediumInterface *)0x0;
  (__return_storage_ptr__->medium).
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  local_98.m.m[0]._0_8_ = *(undefined8 *)(this->mInv).m[0];
  local_98.m.m[0]._8_8_ = *(undefined8 *)((this->mInv).m[0] + 2);
  local_98.m.m[1]._0_8_ = *(undefined8 *)(this->mInv).m[1];
  local_98.m.m[1]._8_8_ = *(undefined8 *)((this->mInv).m[1] + 2);
  local_98.m.m[2]._0_8_ = *(undefined8 *)(this->mInv).m[2];
  local_98.m.m[2]._8_8_ = *(undefined8 *)((this->mInv).m[2] + 2);
  local_98.m.m[3]._0_8_ = *(undefined8 *)(this->mInv).m[3];
  local_98.m.m[3]._8_8_ = *(undefined8 *)((this->mInv).m[3] + 2);
  local_98.mInv.m[0]._0_8_ = *(undefined8 *)(this->m).m[0];
  local_98.mInv.m[0]._8_8_ = *(undefined8 *)((this->m).m[0] + 2);
  local_98.mInv.m[1]._0_8_ = *(undefined8 *)(this->m).m[1];
  local_98.mInv.m[1]._8_8_ = *(undefined8 *)((this->m).m[1] + 2);
  local_98.mInv.m[2]._0_8_ = *(undefined8 *)(this->m).m[2];
  local_98.mInv.m[2]._8_8_ = *(undefined8 *)((this->m).m[2] + 2);
  local_98.mInv.m[3]._0_8_ = *(undefined8 *)(this->m).m[3];
  local_98.mInv.m[3]._8_8_ = *(undefined8 *)((this->m).m[3] + 2);
  operator()(&__return_storage_ptr__->pi,&local_98,&in->pi);
  fVar7 = (in->n).super_Tuple3<pbrt::Normal3,_float>.y;
  fVar3 = (in->n).super_Tuple3<pbrt::Normal3,_float>.x;
  auVar11._4_4_ = fVar3;
  auVar11._0_4_ = fVar3;
  auVar11._8_4_ = fVar3;
  auVar11._12_4_ = fVar3;
  auVar8._8_8_ = 0;
  auVar8._0_4_ = local_98.mInv.m[0][0];
  auVar8._4_4_ = local_98.mInv.m[0][1];
  fVar3 = (in->n).super_Tuple3<pbrt::Normal3,_float>.z;
  auVar13._4_4_ = fVar3;
  auVar13._0_4_ = fVar3;
  auVar13._8_4_ = fVar3;
  auVar13._12_4_ = fVar3;
  auVar10._8_8_ = 0;
  auVar10._0_4_ = local_98.mInv.m[2][0];
  auVar10._4_4_ = local_98.mInv.m[2][1];
  auVar5._0_4_ = fVar7 * local_98.mInv.m[1][0];
  auVar5._4_4_ = fVar7 * local_98.mInv.m[1][1];
  auVar5._8_4_ = fVar7 * 0.0;
  auVar5._12_4_ = fVar7 * 0.0;
  auVar4 = vfmadd231ps_fma(auVar5,auVar11,auVar8);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * local_98.mInv.m[1][2])),auVar11,
                           ZEXT416((uint)local_98.mInv.m[0][2]));
  auVar5 = vfmadd231ps_fma(auVar4,auVar13,auVar10);
  auVar8 = vfmadd231ss_fma(auVar8,auVar13,ZEXT416((uint)local_98.mInv.m[2][2]));
  auVar4._0_4_ = auVar5._0_4_ * auVar5._0_4_;
  auVar4._4_4_ = auVar5._4_4_ * auVar5._4_4_;
  auVar4._8_4_ = auVar5._8_4_ * auVar5._8_4_;
  auVar4._12_4_ = auVar5._12_4_ * auVar5._12_4_;
  uVar2 = vmovlps_avx(auVar5);
  (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  auVar4 = vhaddps_avx(auVar4,auVar4);
  fVar3 = auVar8._0_4_;
  (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.z = fVar3;
  fVar7 = auVar4._0_4_ + fVar3 * fVar3;
  if (0.0 < fVar7) {
    auVar4 = vsqrtss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
    fVar7 = auVar4._0_4_;
    auVar12._4_4_ = fVar7;
    auVar12._0_4_ = fVar7;
    auVar12._8_4_ = fVar7;
    auVar12._12_4_ = fVar7;
    auVar4 = vdivps_avx(auVar5,auVar12);
    uVar2 = vmovlps_avx(auVar4);
    (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar2;
    (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.y =
         (float)(int)((ulong)uVar2 >> 0x20);
    (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.z = fVar3 / fVar7;
  }
  (__return_storage_ptr__->uv).super_Tuple2<pbrt::Point2,_float> =
       (in->uv).super_Tuple2<pbrt::Point2,_float>;
  fVar7 = (in->wo).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar3 = (in->wo).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar1 = (in->wo).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * local_98.m.m[0][1])),ZEXT416((uint)fVar3),
                           ZEXT416((uint)local_98.m.m[0][0]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * local_98.m.m[1][1])),ZEXT416((uint)fVar3),
                           ZEXT416((uint)local_98.m.m[1][0]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * local_98.m.m[2][1])),ZEXT416((uint)fVar3),
                           ZEXT416((uint)local_98.m.m[2][0]));
  auVar10 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar1),ZEXT416((uint)local_98.m.m[0][2]));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar1),ZEXT416((uint)local_98.m.m[1][2]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),ZEXT416((uint)local_98.m.m[2][2]));
  auVar4 = vinsertps_avx(auVar10,auVar5,0x10);
  uVar2 = vmovlps_avx(auVar4);
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  fVar7 = auVar5._0_4_;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.z = auVar8._0_4_;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar10,auVar10);
  auVar4 = vfmadd231ss_fma(auVar4,auVar8,auVar8);
  if (0.0 < auVar4._0_4_) {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    fVar3 = auVar4._0_4_;
    auVar6._0_4_ = auVar10._0_4_ / fVar3;
    auVar6._4_12_ = auVar10._4_12_;
    auVar9._0_4_ = fVar7 / fVar3;
    auVar9._4_12_ = auVar5._4_12_;
    auVar4 = vinsertps_avx(auVar6,auVar9,0x10);
    uVar2 = vmovlps_avx(auVar4);
    (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
    (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)uVar2 >> 0x20);
    (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.z = auVar8._0_4_ / fVar3;
  }
  __return_storage_ptr__->time = in->time;
  __return_storage_ptr__->mediumInterface = in->mediumInterface;
  return __return_storage_ptr__;
}

Assistant:

Interaction Transform::ApplyInverse(const Interaction &in) const {
    Interaction ret;
    Transform t = Inverse(*this);
    ret.pi = t(in.pi);
    ret.n = t(in.n);
    if (LengthSquared(ret.n) > 0)
        ret.n = Normalize(ret.n);
    ret.uv = in.uv;
    ret.wo = t(in.wo);
    if (LengthSquared(ret.wo) > 0)
        ret.wo = Normalize(ret.wo);
    ret.time = in.time;
    ret.mediumInterface = in.mediumInterface;
    return ret;
}